

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O3

CURLcode dyn_nappend(dynbuf *s,uchar *mem,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  CURLcode CVar4;
  char *__ptr;
  ulong uVar5;
  ulong uVar6;
  ulong __size;
  
  sVar1 = s->leng;
  __size = s->toobig;
  uVar5 = len + sVar1 + 1;
  if (__size < uVar5) {
    free(s->bufr);
    s->bufr = (char *)0x0;
    s->leng = 0;
    s->allc = 0;
    CVar4 = CURLE_TOO_LARGE;
  }
  else {
    uVar2 = s->allc;
    uVar3 = uVar2;
    if (uVar2 == 0) {
      if ((0x1f < __size) && (__size = 0x20, 0x20 < uVar5)) {
        __size = uVar5;
      }
    }
    else {
      do {
        uVar6 = uVar3;
        uVar3 = uVar6 * 2;
      } while (uVar6 < uVar5);
      if (uVar6 < __size) {
        __size = uVar6;
      }
    }
    __ptr = s->bufr;
    if (__size != uVar2) {
      __ptr = (char *)realloc(__ptr,__size);
      if (__ptr == (char *)0x0) {
        free(s->bufr);
        s->bufr = (char *)0x0;
        s->leng = 0;
        s->allc = 0;
        return CURLE_OUT_OF_MEMORY;
      }
      s->bufr = __ptr;
      s->allc = __size;
    }
    if (len != 0) {
      memcpy(__ptr + sVar1,mem,len);
      __ptr = s->bufr;
    }
    s->leng = len + sVar1;
    __ptr[len + sVar1] = '\0';
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode dyn_nappend(struct dynbuf *s,
                            const unsigned char *mem, size_t len)
{
  size_t indx = s->leng;
  size_t a = s->allc;
  size_t fit = len + indx + 1; /* new string + old string + zero byte */

  /* try to detect if there is rubbish in the struct */
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(s->toobig);
  DEBUGASSERT(indx < s->toobig);
  DEBUGASSERT(!s->leng || s->bufr);
  DEBUGASSERT(a <= s->toobig);
  DEBUGASSERT(!len || mem);

  if(fit > s->toobig) {
    Curl_dyn_free(s);
    return CURLE_TOO_LARGE;
  }
  else if(!a) {
    DEBUGASSERT(!indx);
    /* first invoke */
    if(MIN_FIRST_ALLOC > s->toobig)
      a = s->toobig;
    else if(fit < MIN_FIRST_ALLOC)
      a = MIN_FIRST_ALLOC;
    else
      a = fit;
  }
  else {
    while(a < fit)
      a *= 2;
    if(a > s->toobig)
      /* no point in allocating a larger buffer than this is allowed to use */
      a = s->toobig;
  }

  if(a != s->allc) {
    /* this logic is not using Curl_saferealloc() to make the tool not have to
       include that as well when it uses this code */
    void *p = realloc(s->bufr, a);
    if(!p) {
      Curl_dyn_free(s);
      return CURLE_OUT_OF_MEMORY;
    }
    s->bufr = p;
    s->allc = a;
  }

  if(len)
    memcpy(&s->bufr[indx], mem, len);
  s->leng = indx + len;
  s->bufr[s->leng] = 0;
  return CURLE_OK;
}